

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  cmTargets *this_00;
  _Rb_tree_header *p_Var1;
  cmMakefile *pcVar2;
  cmake *pcVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  PolicyID id;
  __node_base _Var13;
  ulong uVar14;
  pointer this_01;
  AutogensType autogens;
  cmTargets globalTargets;
  ostringstream w;
  undefined1 local_278 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_258;
  PositionType local_250;
  AutogensType local_248;
  string local_230;
  Snapshot local_210;
  Snapshot local_1f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0;
  undefined1 local_1a8 [8];
  pointer pcStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_188;
  PositionType local_180;
  ios_base local_138 [264];
  
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x20])();
  if ((char)iVar5 != '\0') {
    FinalizeTargetCompileInfo(this);
    local_248.
    super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.
    super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.
    super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CreateQtAutoGeneratorsTargets(this,&local_248);
    local_1e0._M_buckets = &local_1e0._M_single_bucket;
    local_1e0._M_bucket_count = 1;
    local_1e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e0._M_element_count = 0;
    local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0._M_rehash_policy._M_next_resize = 0;
    local_1e0._M_single_bucket = (__node_base_ptr)0x0;
    CreateDefaultGlobalTargets(this,(cmTargets *)&local_1e0);
    ppcVar7 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar8 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar8 != ppcVar7) {
      uVar12 = 0;
      do {
        cmLocalGenerator::ComputeObjectMaxPath(ppcVar7[uVar12]);
        ppcVar7 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_1e0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          pcVar2 = ppcVar7[uVar12]->Makefile;
          this_00 = &pcVar2->Targets;
          _Var13._M_nxt = local_1e0._M_before_begin._M_nxt;
          do {
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_00,(key_type *)(_Var13._M_nxt + 1));
            cmTarget::operator=(pmVar6,(cmTarget *)(_Var13._M_nxt + 5));
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_00,(key_type *)(_Var13._M_nxt + 1));
            cmTarget::SetMakefile(pmVar6,pcVar2);
            _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt;
          } while (_Var13._M_nxt != (_Hash_node_base *)0x0);
          ppcVar7 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        ppcVar8 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      } while (uVar12 < (ulong)((long)ppcVar8 - (long)ppcVar7 >> 3));
    }
    if (ppcVar8 != ppcVar7) {
      uVar12 = 0;
      uVar14 = 1;
      do {
        (*ppcVar7[uVar12]->_vptr_cmLocalGenerator[4])();
        ppcVar7 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar4 = uVar14 < (ulong)((long)(this->LocalGenerators).
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >>
                                3);
        uVar12 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar4);
    }
    CreateGeneratorTargets(this);
    for (this_01 = local_248.
                   super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        local_248.
        super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      cmQtAutoGenerators::SetupAutoGenerateTarget(&this_01->first,this_01->second);
    }
    ppcVar7 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar7) {
      uVar12 = 0;
      uVar14 = 1;
      do {
        cmLocalGenerator::TraceDependencies(ppcVar7[uVar12]);
        ppcVar7 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar4 = uVar14 < (ulong)((long)(this->LocalGenerators).
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >>
                                3);
        uVar12 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar4);
    }
    (*this->_vptr_cmGlobalGenerator[0x23])(this);
    ppcVar7 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar7) {
      uVar12 = 0;
      uVar14 = 1;
      do {
        cmLocalGenerator::GenerateTargetManifest(ppcVar7[uVar12]);
        ppcVar7 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar4 = uVar14 < (ulong)((long)(this->LocalGenerators).
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >>
                                3);
        uVar12 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar4);
    }
    ProcessEvaluationFiles(this);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x1f])(this);
    if ((char)iVar5 != '\0') {
      FillLocalGeneratorToTargetMap(this);
      ppcVar8 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar7 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar7 != ppcVar8) {
        uVar12 = 0;
        uVar14 = 1;
        do {
          (*ppcVar8[uVar12]->_vptr_cmLocalGenerator[3])();
          ppcVar8 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppcVar7 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          bVar4 = uVar14 < (ulong)((long)ppcVar7 - (long)ppcVar8 >> 3);
          uVar12 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar4);
      }
      if (ppcVar7 != ppcVar8) {
        uVar12 = 0;
        do {
          this->CurrentMakefile = ppcVar8[uVar12]->Makefile;
          (*ppcVar8[uVar12]->_vptr_cmLocalGenerator[2])();
          pcVar2 = (this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12]->Makefile;
          local_1a8 = (undefined1  [8])&local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","");
          bVar4 = cmMakefile::IsOn(pcVar2,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
          }
          if (!bVar4) {
            cmLocalGenerator::GenerateInstallRules
                      ((this->LocalGenerators).
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar12]);
          }
          cmLocalGenerator::GenerateTestFiles
                    ((this->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12]);
          cmake::UpdateProgress
                    (this->CMakeInstance,"Generating",
                     ((float)uVar12 + 1.0) /
                     (float)(ulong)((long)(this->LocalGenerators).
                                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->LocalGenerators).
                                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
          uVar12 = (ulong)((int)uVar12 + 1);
          ppcVar8 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(this->LocalGenerators).
                                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar8
                                 >> 3));
      }
      this->CurrentMakefile = (cmMakefile *)0x0;
      GenerateCPackPropertiesFile(this);
      for (p_Var9 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        bVar4 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var9 + 2));
        if ((((!bVar4) && (cmSystemTools::s_ErrorOccured == false)) &&
            (cmSystemTools::s_FatalErrorOccured == false)) &&
           (bVar4 = cmSystemTools::GetInterruptFlag(), !bVar4)) {
          pcVar3 = this->CMakeInstance;
          local_278._0_8_ = local_278 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"Could not write export file.","");
          cmState::Snapshot::Snapshot(&local_1f8,(cmState *)0x0,(PositionType)ZEXT816(0));
          local_180 = local_1f8.Position.Position;
          local_198._8_8_ = local_1f8.State;
          pcStack_188 = local_1f8.Position.Tree;
          local_1a8 = (undefined1  [8])0x0;
          pcStack_1a0 = (pointer)0x0;
          local_198._M_allocated_capacity = 0;
          cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_278,
                              (cmListFileBacktrace *)local_1a8);
          std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                    ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_1a8);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          goto LAB_0031ded2;
        }
      }
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[6])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_278,(cmPolicies *)0x2a,id);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"MACOSX_RPATH is not specified for the following targets:\n"
                   ,0x39);
        p_Var11 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var11 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,*(char **)(p_Var11 + 1),
                                 (long)p_Var11[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != p_Var1);
        }
        pcVar3 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmState::Snapshot::Snapshot(&local_210,(cmState *)0x0,(PositionType)ZEXT816(0));
        local_250 = local_210.Position.Position;
        local_278._24_8_ = local_210.State;
        pcStack_258 = local_210.Position.Tree;
        local_278._0_8_ = (char *)0x0;
        local_278._8_8_ = (pointer)0x0;
        local_278._16_8_ = 0;
        cmake::IssueMessage(pcVar3,AUTHOR_WARNING,&local_230,(cmListFileBacktrace *)local_278);
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
    }
LAB_0031ded2:
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1e0);
    std::
    vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ::~vector(&local_248);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Check whether this generator is allowed to run.
  if(!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS())
    {
    return;
    }

  this->FinalizeTargetCompileInfo();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  AutogensType autogens;
  this->CreateQtAutoGeneratorsTargets(autogens);
#endif

  // For each existing cmLocalGenerator
  unsigned int i;

  // Put a copy of each global target in every directory.
  cmTargets globalTargets;
  this->CreateDefaultGlobalTargets(&globalTargets);
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeObjectMaxPath();
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    cmTargets* targets = &(mf->GetTargets());
    cmTargets::iterator tit;
    for ( tit = globalTargets.begin(); tit != globalTargets.end(); ++ tit )
      {
      (*targets)[tit->first] = tit->second;
      (*targets)[tit->first].SetMakefile(mf);
      }
    }

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->AddHelperCommands();
    }

  // Create per-target generator information.
  this->CreateGeneratorTargets();

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (AutogensType::iterator it = autogens.begin(); it != autogens.end();
       ++it)
    {
    it->first.SetupAutoGenerateTarget(it->second);
    }
#endif

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->TraceDependencies();
    }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->GenerateTargetManifest();
    }

  this->ProcessEvaluationFiles();

  // Compute the inter-target dependencies.
  if(!this->ComputeTargetDepends())
    {
    return;
    }

  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->FillLocalGeneratorToTargetMap();

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
    }

  // Generate project files
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if(!this->LocalGenerators[i]->GetMakefile()->IsOn(
      "CMAKE_SKIP_INSTALL_RULES"))
      {
      this->LocalGenerators[i]->GenerateInstallRules();
      }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress("Generating",
      (static_cast<float>(i)+1.0f)/
       static_cast<float>(this->LocalGenerators.size()));
    }
  this->SetCurrentMakefile(0);

  if(!this->GenerateCPackPropertiesFile())
    {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
    }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator
      it = this->BuildExportSets.begin(); it != this->BuildExportSets.end();
      ++it)
    {
    if (!it->second->GenerateImportFile()
        && !cmSystemTools::GetErrorOccuredFlag())
      {
      this->GetCMakeInstance()
          ->IssueMessage(cmake::FATAL_ERROR, "Could not write export file.");
      return;
      }
    }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != 0)
    {
    this->ExtraGenerator->Generate();
    }

  if(!this->CMP0042WarnTargets.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for(std::set<std::string>::iterator
      iter = this->CMP0042WarnTargets.begin();
      iter != this->CMP0042WarnTargets.end();
      ++iter)
      {
      w << " " << *iter << "\n";
      }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}